

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O3

void __thiscall ot::commissioner::CommissionerSafe::StopEventLoopThread(CommissionerSafe *this)

{
  undefined8 uVar1;
  promise<void> *__state;
  promise<void> pro;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  promise<void> local_28;
  
  std::promise<void>::promise(&local_28);
  if ((((this->mEventBase).mEventBase != (event_base *)0x0) &&
      ((this->mImpl).
       super___shared_ptr<ot::commissioner::CommissionerImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
       (element_type *)0x0)) && ((this->mEventThread)._M_id._M_thread != 0)) {
    local_30 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:126:22)>
               ::_M_invoke;
    local_38 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:126:22)>
               ::_M_manager;
    local_48._M_unused._M_object = (_State_baseV2 *)&local_28;
    local_48._8_8_ = this;
    PushAsyncRequest(this,(AsyncRequest *)&local_48);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
    __state = &local_28;
    std::__basic_future<void>::__basic_future((__basic_future<void> *)&local_48,&__state->_M_future)
    ;
    if ((_State_baseV2 *)local_48._M_unused._0_8_ == (_State_baseV2 *)0x0) {
      uVar1 = std::__throw_future_error(3);
      __clang_call_terminate(uVar1);
    }
    std::__future_base::_State_baseV2::wait((_State_baseV2 *)local_48._M_unused._0_8_,__state);
    if ((CommissionerSafe *)local_48._8_8_ != (CommissionerSafe *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
    }
    std::thread::join();
  }
  std::promise<void>::~promise(&local_28);
  return;
}

Assistant:

void CommissionerSafe::StopEventLoopThread(void)
{
    std::promise<void> pro;

    VerifyOrExit(mEventBase.Get() != nullptr && mImpl != nullptr);
    VerifyOrExit(mEventThread.joinable());

    // Send `Stop` to the event loop to break it from inside.
    // This makes sure the event loop has been started when we
    // trying to break it.
    PushAsyncRequest([&pro, this]() {
        event_base_loopbreak(mEventBase.Get());
        pro.set_value();
    });

    pro.get_future().wait();

    mEventThread.join();

exit:
    return;
}